

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_get_img_format(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  uint uVar1;
  aom_img_fmt_t *paVar2;
  long lVar3;
  aom_img_fmt_t aVar4;
  uint *in_RSI;
  long in_RDI;
  AV1_COMMON *cm;
  FrameWorkerData *frame_worker_data;
  AVxWorker *worker;
  aom_img_fmt_t *img_fmt;
  long *local_50;
  aom_codec_err_t local_4;
  
  uVar1 = *in_RSI;
  if (uVar1 < 0x29) {
    local_50 = (long *)((long)(int)uVar1 + *(long *)(in_RSI + 4));
    *in_RSI = uVar1 + 8;
  }
  else {
    local_50 = *(long **)(in_RSI + 2);
    *(long **)(in_RSI + 2) = local_50 + 1;
  }
  paVar2 = (aom_img_fmt_t *)*local_50;
  if (paVar2 == (aom_img_fmt_t *)0x0) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else if (*(long *)(in_RDI + 0x69f0) == 0) {
    local_4 = AOM_CODEC_ERROR;
  }
  else {
    lVar3 = **(long **)(*(long *)(in_RDI + 0x69f0) + 0x20);
    aVar4 = get_img_format(*(int *)(*(long *)(lVar3 + 0x9be8) + 0x60),
                           *(int *)(*(long *)(lVar3 + 0x9be8) + 100),
                           (uint)*(byte *)(*(long *)(lVar3 + 0x9be8) + 0x4c));
    *paVar2 = aVar4;
    local_4 = AOM_CODEC_OK;
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_get_img_format(aom_codec_alg_priv_t *ctx,
                                           va_list args) {
  aom_img_fmt_t *const img_fmt = va_arg(args, aom_img_fmt_t *);
  AVxWorker *const worker = ctx->frame_worker;

  if (img_fmt) {
    if (worker) {
      FrameWorkerData *const frame_worker_data =
          (FrameWorkerData *)worker->data1;
      const AV1_COMMON *const cm = &frame_worker_data->pbi->common;

      *img_fmt = get_img_format(cm->seq_params->subsampling_x,
                                cm->seq_params->subsampling_y,
                                cm->seq_params->use_highbitdepth);
      return AOM_CODEC_OK;
    } else {
      return AOM_CODEC_ERROR;
    }
  }

  return AOM_CODEC_INVALID_PARAM;
}